

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_sequence(fy_emitter *emit,fy_node *fyn,int flags,int indent)

{
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar1;
  fy_token *pfVar2;
  fy_token *fyn_00;
  fy_token *pfVar3;
  fy_emit_save_ctx sct;
  fy_emit_save_ctx local_58;
  
  local_58.fyt_last_key = (fy_token *)0x0;
  local_58.fyt_last_value = (fy_token *)0x0;
  local_58.s_flags = 0;
  local_58.s_indent = 0;
  local_58.indent = indent;
  local_58.flags = flags;
  paVar1 = &fyn->field_12;
  local_58._1_3_ = 0;
  local_58._0_1_ =
       (byte)flags >> 3 & 2 | fyn->style == FYNS_FLOW |
       ((fyn->field_12).scalar == (fy_token *)paVar1) << 2;
  local_58.old_indent = indent;
  fy_emit_sequence_prolog(emit,&local_58);
  fyn_00 = (fy_token *)0x0;
  if ((fyn->field_12).scalar != (fy_token *)paVar1) {
    fyn_00 = (fyn->field_12).scalar;
  }
  while (fyn_00 != (fy_token *)0x0) {
    pfVar2 = (fy_token *)(fyn_00->node).next;
    pfVar3 = (fy_token *)0x0;
    if (pfVar2 != (fy_token *)paVar1) {
      pfVar3 = pfVar2;
    }
    pfVar2 = fy_node_value_token((fy_node *)fyn_00);
    fy_emit_sequence_item_prolog(emit,&local_58,pfVar2);
    fy_emit_node_internal(emit,(fy_node *)fyn_00,local_58.flags,local_58.indent,false);
    fy_emit_sequence_item_epilog(emit,&local_58,pfVar3 == (fy_token *)0x0,pfVar2);
    fyn_00 = pfVar3;
  }
  fy_emit_sequence_epilog(emit,&local_58);
  return;
}

Assistant:

void fy_emit_sequence(struct fy_emitter *emit, struct fy_node *fyn, int flags, int indent) {
    struct fy_node *fyni, *fynin;
    struct fy_token *fyt_value;
    bool last;
    struct fy_emit_save_ctx sct, *sc = &sct;

    memset(sc, 0, sizeof(*sc));

    sc->flags = flags;
    sc->indent = indent;
    sc->empty = fy_node_list_empty(&fyn->sequence);
    sc->flow_token = fyn->style == FYNS_FLOW;
    sc->flow = !!(flags & DDNF_FLOW);
    sc->old_indent = sc->indent;

    fy_emit_sequence_prolog(emit, sc);

    for (fyni = fy_node_list_head(&fyn->sequence); fyni; fyni = fynin) {

        fynin = fy_node_next(&fyn->sequence, fyni);
        last = !fynin;
        fyt_value = fy_node_value_token(fyni);

        fy_emit_sequence_item_prolog(emit, sc, fyt_value);
        fy_emit_node_internal(emit, fyni, sc->flags, sc->indent, false);
        fy_emit_sequence_item_epilog(emit, sc, last, fyt_value);
    }

    fy_emit_sequence_epilog(emit, sc);
}